

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPlaneCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtConvexPlaneCollisionAlgorithm::collideSingleContact
          (cbtConvexPlaneCollisionAlgorithm *this,cbtQuaternion *perturbeRot,
          cbtCollisionObjectWrapper *body0Wrap,cbtCollisionObjectWrapper *body1Wrap,
          cbtDispatcherInfo *dispatchInfo,cbtManifoldResult *resultOut)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  float fVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  cbtCollisionShape *pcVar17;
  cbtCollisionShape *pcVar18;
  cbtTransform *pcVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  cbtCollisionObjectWrapper *pcVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  cbtScalar cVar49;
  cbtScalar acVar50 [4];
  float fVar51;
  cbtVector3 normalOnSurfaceB;
  cbtMatrix3x3 local_70;
  float local_40;
  float local_3c;
  float local_38;
  
  pcVar36 = body1Wrap;
  if (this->m_isSwapped != false) {
    pcVar36 = body0Wrap;
    body0Wrap = body1Wrap;
  }
  pcVar17 = pcVar36->m_shape;
  pcVar18 = body0Wrap->m_shape;
  pcVar19 = body0Wrap->m_worldTransform;
  cVar1 = (pcVar19->m_basis).m_el[0].m_floats[0];
  fVar51 = (pcVar19->m_basis).m_el[0].m_floats[1];
  cVar2 = (pcVar19->m_basis).m_el[0].m_floats[2];
  fVar3 = (pcVar19->m_basis).m_el[1].m_floats[0];
  fVar4 = (pcVar19->m_basis).m_el[1].m_floats[1];
  fVar5 = (pcVar19->m_basis).m_el[1].m_floats[2];
  cVar6 = (pcVar19->m_basis).m_el[2].m_floats[0];
  cVar7 = (pcVar19->m_basis).m_el[2].m_floats[1];
  cVar8 = (pcVar19->m_basis).m_el[2].m_floats[2];
  cVar9 = (pcVar19->m_origin).m_floats[0];
  fVar10 = (pcVar19->m_origin).m_floats[1];
  cVar49 = (pcVar19->m_origin).m_floats[2];
  cbtTransform::inverse(pcVar36->m_worldTransform);
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * local_70.m_el[0].m_floats[1])),
                            ZEXT416((uint)cVar1),ZEXT416((uint)local_70.m_el[0].m_floats[0]));
  auVar24 = vfmadd231ss_fma(auVar37,ZEXT416((uint)cVar6),ZEXT416((uint)local_70.m_el[0].m_floats[2])
                           );
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * local_70.m_el[0].m_floats[1])),
                            ZEXT416((uint)fVar51),ZEXT416((uint)local_70.m_el[0].m_floats[0]));
  auVar25 = vfmadd231ss_fma(auVar37,ZEXT416((uint)cVar7),ZEXT416((uint)local_70.m_el[0].m_floats[2])
                           );
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_70.m_el[0].m_floats[1])),
                            ZEXT416((uint)cVar2),ZEXT416((uint)local_70.m_el[0].m_floats[0]));
  auVar26 = vfmadd231ss_fma(auVar37,ZEXT416((uint)cVar8),ZEXT416((uint)local_70.m_el[0].m_floats[2])
                           );
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * local_70.m_el[1].m_floats[1])),
                            ZEXT416((uint)cVar1),ZEXT416((uint)local_70.m_el[1].m_floats[0]));
  auVar27 = vfmadd231ss_fma(auVar37,ZEXT416((uint)cVar6),ZEXT416((uint)local_70.m_el[1].m_floats[2])
                           );
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * local_70.m_el[1].m_floats[1])),
                            ZEXT416((uint)fVar51),ZEXT416((uint)local_70.m_el[1].m_floats[0]));
  auVar28 = vfmadd231ss_fma(auVar37,ZEXT416((uint)cVar7),ZEXT416((uint)local_70.m_el[1].m_floats[2])
                           );
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_70.m_el[1].m_floats[1])),
                            ZEXT416((uint)cVar2),ZEXT416((uint)local_70.m_el[1].m_floats[0]));
  auVar29 = vfmadd231ss_fma(auVar37,ZEXT416((uint)cVar8),ZEXT416((uint)local_70.m_el[1].m_floats[2])
                           );
  auVar37 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar3 * local_70.m_el[2].m_floats[1])),
                                ZEXT416((uint)cVar1),ZEXT416((uint)local_70.m_el[2].m_floats[0]));
  auVar30 = vfmadd231ss_fma(auVar37,ZEXT416((uint)cVar6),ZEXT416((uint)local_70.m_el[2].m_floats[2])
                           );
  auVar37 = vmulss_avx512f(ZEXT416((uint)fVar4),ZEXT416((uint)local_70.m_el[2].m_floats[1]));
  auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416((uint)fVar51),
                                ZEXT416((uint)local_70.m_el[2].m_floats[0]));
  auVar31 = vfmadd231ss_fma(auVar37,ZEXT416((uint)cVar7),ZEXT416((uint)local_70.m_el[2].m_floats[2])
                           );
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_70.m_el[2].m_floats[1])),
                            ZEXT416((uint)cVar2),ZEXT416((uint)local_70.m_el[2].m_floats[0]));
  auVar32 = vfmadd231ss_fma(auVar37,ZEXT416((uint)cVar8),ZEXT416((uint)local_70.m_el[2].m_floats[2])
                           );
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * local_70.m_el[0].m_floats[1])),
                            ZEXT416((uint)cVar9),ZEXT416((uint)local_70.m_el[0].m_floats[0]));
  auVar33 = vfmadd231ss_fma(auVar37,ZEXT416((uint)cVar49),
                            ZEXT416((uint)local_70.m_el[0].m_floats[2]));
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * local_70.m_el[1].m_floats[1])),
                            ZEXT416((uint)cVar9),ZEXT416((uint)local_70.m_el[1].m_floats[0]));
  auVar34 = vfmadd231ss_fma(auVar37,ZEXT416((uint)cVar49),
                            ZEXT416((uint)local_70.m_el[1].m_floats[2]));
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * local_70.m_el[2].m_floats[1])),
                            ZEXT416((uint)cVar9),ZEXT416((uint)local_70.m_el[2].m_floats[0]));
  auVar35 = vfmadd231ss_fma(auVar37,ZEXT416((uint)cVar49),
                            ZEXT416((uint)local_70.m_el[2].m_floats[2]));
  cbtMatrix3x3::setRotation(&local_70,perturbeRot);
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * local_70.m_el[1].m_floats[0])),
                            ZEXT416((uint)local_70.m_el[0].m_floats[0]),ZEXT416((uint)cVar1));
  auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)local_70.m_el[2].m_floats[0]),ZEXT416((uint)cVar2)
                           );
  auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * local_70.m_el[1].m_floats[1])),
                            ZEXT416((uint)local_70.m_el[0].m_floats[1]),ZEXT416((uint)cVar1));
  auVar47 = vfmadd231ss_fma(auVar47,ZEXT416((uint)local_70.m_el[2].m_floats[1]),ZEXT416((uint)cVar2)
                           );
  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * local_70.m_el[1].m_floats[2])),
                            ZEXT416((uint)local_70.m_el[0].m_floats[2]),ZEXT416((uint)cVar1));
  auVar48 = vfmadd231ss_fma(auVar48,ZEXT416((uint)local_70.m_el[2].m_floats[2]),ZEXT416((uint)cVar2)
                           );
  auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * local_70.m_el[1].m_floats[0])),
                            ZEXT416((uint)local_70.m_el[0].m_floats[0]),ZEXT416((uint)fVar3));
  auVar38 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)local_70.m_el[2].m_floats[0]),
                                ZEXT416((uint)fVar5));
  auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * local_70.m_el[1].m_floats[1])),
                            ZEXT416((uint)local_70.m_el[0].m_floats[1]),ZEXT416((uint)fVar3));
  auVar39 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)local_70.m_el[2].m_floats[1]),
                                ZEXT416((uint)fVar5));
  auVar40 = vmulss_avx512f(ZEXT416((uint)fVar4),ZEXT416((uint)local_70.m_el[1].m_floats[2]));
  auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)local_70.m_el[0].m_floats[2]),ZEXT416((uint)fVar3)
                           );
  auVar41 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)local_70.m_el[2].m_floats[2]),
                                ZEXT416((uint)fVar5));
  auVar40 = vmulss_avx512f(ZEXT416((uint)cVar7),ZEXT416((uint)local_70.m_el[1].m_floats[0]));
  auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)cVar6),ZEXT416((uint)local_70.m_el[0].m_floats[0])
                           );
  auVar42 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)cVar8),
                                ZEXT416((uint)local_70.m_el[2].m_floats[0]));
  auVar40 = vmulss_avx512f(ZEXT416((uint)cVar7),ZEXT416((uint)local_70.m_el[1].m_floats[1]));
  auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)cVar6),ZEXT416((uint)local_70.m_el[0].m_floats[1])
                           );
  auVar43 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)cVar8),
                                ZEXT416((uint)local_70.m_el[2].m_floats[1]));
  auVar40 = vmulss_avx512f(ZEXT416((uint)cVar7),ZEXT416((uint)local_70.m_el[1].m_floats[2]));
  auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)local_70.m_el[0].m_floats[2]),ZEXT416((uint)cVar6)
                           );
  auVar44 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)local_70.m_el[2].m_floats[2]),
                                ZEXT416((uint)cVar8));
  pcVar19 = pcVar36->m_worldTransform;
  fVar51 = (pcVar19->m_basis).m_el[1].m_floats[0];
  cVar1 = (pcVar19->m_basis).m_el[0].m_floats[0];
  cVar2 = (pcVar19->m_basis).m_el[0].m_floats[1];
  auVar40 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * fVar51)),ZEXT416((uint)cVar1),auVar37);
  cVar6 = (pcVar19->m_basis).m_el[2].m_floats[0];
  auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)cVar6),auVar42);
  fVar3 = (pcVar19->m_basis).m_el[1].m_floats[1];
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * fVar3)),ZEXT416((uint)cVar2),auVar37);
  cVar7 = (pcVar19->m_basis).m_el[2].m_floats[1];
  auVar45 = vfmadd231ss_avx512f(auVar46,ZEXT416((uint)cVar7),auVar42);
  cVar8 = (pcVar19->m_basis).m_el[0].m_floats[2];
  cVar9 = (pcVar19->m_basis).m_el[1].m_floats[2];
  auVar46 = vmulss_avx512f(auVar38,ZEXT416((uint)cVar9));
  auVar37 = vfmadd231ss_avx512f(auVar46,ZEXT416((uint)cVar8),auVar37);
  cVar49 = (pcVar19->m_basis).m_el[2].m_floats[2];
  auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)cVar49),auVar42);
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ * fVar51)),ZEXT416((uint)cVar1),auVar47);
  auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)cVar6),auVar43);
  auVar38 = vmulss_avx512f(auVar39,ZEXT416((uint)fVar3));
  auVar38 = vfmadd231ss_avx512f(auVar38,ZEXT416((uint)cVar2),auVar47);
  auVar42 = vfmadd231ss_avx512f(auVar38,ZEXT416((uint)cVar7),auVar43);
  auVar38 = vmulss_avx512f(auVar39,ZEXT416((uint)cVar9));
  auVar47 = vfmadd231ss_avx512f(auVar38,ZEXT416((uint)cVar8),auVar47);
  auVar47 = vfmadd231ss_fma(auVar47,ZEXT416((uint)cVar49),auVar43);
  auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * fVar51)),auVar48,ZEXT416((uint)cVar1));
  auVar38 = vfmadd231ss_fma(auVar38,auVar44,ZEXT416((uint)cVar6));
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * auVar41._0_4_)),auVar48,ZEXT416((uint)cVar2));
  auVar39 = vfmadd231ss_avx512f(auVar39,auVar44,ZEXT416((uint)cVar7));
  auVar41 = vmulss_avx512f(auVar41,ZEXT416((uint)cVar9));
  auVar48 = vfmadd231ss_avx512f(auVar41,ZEXT416((uint)cVar8),auVar48);
  auVar48 = vfmadd231ss_fma(auVar48,ZEXT416((uint)cVar49),auVar44);
  uVar11 = *(uint *)&pcVar17[2]._vptr_cbtCollisionShape;
  fVar51 = *(float *)((long)&pcVar17[2]._vptr_cbtCollisionShape + 4);
  uVar12 = pcVar17[2].m_shapeType;
  auVar40 = vfnmsub231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar51)),ZEXT416(uVar11),auVar40);
  auVar37 = vfnmadd231ss_fma(auVar40,ZEXT416(uVar12),auVar37);
  auVar40 = vmulss_avx512f(auVar42,ZEXT416((uint)fVar51));
  auVar40 = vfnmsub231ss_fma(auVar40,ZEXT416(uVar11),auVar46);
  auVar47 = vfnmadd231ss_fma(auVar40,ZEXT416(uVar12),auVar47);
  auVar37 = vinsertps_avx(auVar37,auVar47,0x10);
  auVar47 = vfnmsub231ss_fma(ZEXT416((uint)(auVar39._0_4_ * fVar51)),ZEXT416(uVar11),auVar38);
  auVar47 = vfnmadd231ss_fma(auVar47,ZEXT416(uVar12),auVar48);
  acVar50 = (cbtScalar  [4])vinsertps_avx(auVar37,auVar47,0x28);
  local_70.m_el[0].m_floats = acVar50;
  (*pcVar18->_vptr_cbtCollisionShape[0x10])(pcVar18,&local_70);
  auVar37 = vmovshdup_avx((undefined1  [16])acVar50);
  fVar51 = auVar37._0_4_;
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * auVar25._0_4_)),(undefined1  [16])acVar50,
                            ZEXT416(auVar24._0_4_));
  auVar37 = vfmadd231ss_fma(auVar37,auVar38,ZEXT416(auVar26._0_4_));
  fVar20 = auVar37._0_4_ + auVar33._0_4_ + local_40;
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * auVar28._0_4_)),(undefined1  [16])acVar50,
                            ZEXT416(auVar27._0_4_));
  auVar37 = vfmadd231ss_fma(auVar37,auVar38,ZEXT416(auVar29._0_4_));
  fVar21 = auVar37._0_4_ + auVar34._0_4_ + local_3c;
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * auVar31._0_4_)),(undefined1  [16])acVar50,
                            ZEXT416(auVar30._0_4_));
  auVar37 = vfmadd231ss_fma(auVar37,auVar38,ZEXT416(auVar32._0_4_));
  fVar22 = auVar37._0_4_ + auVar35._0_4_ + local_38;
  fVar51 = *(float *)&pcVar17[2]._vptr_cbtCollisionShape;
  fVar3 = *(float *)((long)&pcVar17[2]._vptr_cbtCollisionShape + 4);
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar21)),ZEXT416((uint)fVar51),
                            ZEXT416((uint)fVar20));
  fVar4 = (float)pcVar17[2].m_shapeType;
  auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar4),ZEXT416((uint)fVar22));
  fVar23 = auVar37._0_4_ - *(float *)&pcVar17[2].m_userPointer;
  pcVar19 = pcVar36->m_worldTransform;
  cVar1 = (pcVar19->m_basis).m_el[0].m_floats[0];
  fVar5 = (pcVar19->m_basis).m_el[0].m_floats[1];
  cVar2 = (pcVar19->m_basis).m_el[0].m_floats[2];
  cVar6 = (pcVar19->m_basis).m_el[1].m_floats[0];
  fVar10 = (pcVar19->m_basis).m_el[1].m_floats[1];
  cVar7 = (pcVar19->m_basis).m_el[1].m_floats[2];
  cVar8 = (pcVar19->m_basis).m_el[2].m_floats[0];
  fVar13 = (pcVar19->m_basis).m_el[2].m_floats[1];
  cVar9 = (pcVar19->m_basis).m_el[2].m_floats[2];
  fVar14 = (pcVar19->m_origin).m_floats[0];
  fVar15 = (pcVar19->m_origin).m_floats[1];
  fVar16 = (pcVar19->m_origin).m_floats[2];
  cVar49 = cbtPersistentManifold::getContactBreakingThreshold(this->m_manifoldPtr);
  resultOut->m_manifoldPtr = this->m_manifoldPtr;
  if (fVar23 < cVar49) {
    fVar22 = fVar22 - fVar23 * fVar4;
    fVar20 = fVar20 - fVar23 * fVar51;
    fVar21 = fVar21 - fVar23 * fVar3;
    auVar37 = vfmadd213ss_fma(ZEXT416((uint)cVar8),ZEXT416((uint)fVar20),
                              ZEXT416((uint)(fVar21 * fVar13)));
    auVar24 = vfmadd213ss_fma(ZEXT416((uint)cVar9),ZEXT416((uint)fVar22),auVar37);
    auVar37 = vfmadd213ss_fma(ZEXT416((uint)cVar1),ZEXT416((uint)fVar20),
                              ZEXT416((uint)(fVar21 * fVar5)));
    auVar37 = vfmadd213ss_fma(ZEXT416((uint)cVar2),ZEXT416((uint)fVar22),auVar37);
    auVar25 = vfmadd213ss_fma(ZEXT416((uint)cVar6),ZEXT416((uint)fVar20),
                              ZEXT416((uint)(fVar21 * fVar10)));
    auVar25 = vfmadd213ss_fma(ZEXT416((uint)cVar7),ZEXT416((uint)fVar22),auVar25);
    auVar37 = vinsertps_avx(ZEXT416((uint)(auVar37._0_4_ + fVar14)),
                            ZEXT416((uint)(auVar25._0_4_ + fVar15)),0x10);
    vinsertps_avx(auVar37,ZEXT416((uint)(auVar24._0_4_ + fVar16)),0x28);
    pcVar19 = pcVar36->m_worldTransform;
    uVar11 = *(uint *)&pcVar17[2]._vptr_cbtCollisionShape;
    fVar51 = *(float *)((long)&pcVar17[2]._vptr_cbtCollisionShape + 4);
    auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * (pcVar19->m_basis).m_el[0].m_floats[1])),
                              ZEXT416(uVar11),ZEXT416((uint)(pcVar19->m_basis).m_el[0].m_floats[0]))
    ;
    uVar12 = pcVar17[2].m_shapeType;
    auVar37 = vfmadd231ss_fma(auVar37,ZEXT416(uVar12),
                              ZEXT416((uint)(pcVar19->m_basis).m_el[0].m_floats[2]));
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * (pcVar19->m_basis).m_el[1].m_floats[1])),
                              ZEXT416(uVar11),ZEXT416((uint)(pcVar19->m_basis).m_el[1].m_floats[0]))
    ;
    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416(uVar12),
                              ZEXT416((uint)(pcVar19->m_basis).m_el[1].m_floats[2]));
    auVar37 = vinsertps_avx(auVar37,auVar24,0x10);
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * (pcVar19->m_basis).m_el[2].m_floats[1])),
                              ZEXT416(uVar11),ZEXT416((uint)(pcVar19->m_basis).m_el[2].m_floats[0]))
    ;
    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416(uVar12),
                              ZEXT416((uint)(pcVar19->m_basis).m_el[2].m_floats[2]));
    local_70.m_el[0].m_floats = (cbtScalar  [4])vinsertps_avx(auVar37,auVar24,0x28);
    (*(resultOut->super_Result)._vptr_Result[4])((ulong)(uint)fVar23);
  }
  return;
}

Assistant:

void cbtConvexPlaneCollisionAlgorithm::collideSingleContact(const cbtQuaternion& perturbeRot, const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	const cbtCollisionObjectWrapper* convexObjWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* planeObjWrap = m_isSwapped ? body0Wrap : body1Wrap;

	cbtConvexShape* convexShape = (cbtConvexShape*)convexObjWrap->getCollisionShape();
	cbtStaticPlaneShape* planeShape = (cbtStaticPlaneShape*)planeObjWrap->getCollisionShape();

	bool hasCollision = false;
	const cbtVector3& planeNormal = planeShape->getPlaneNormal();
	const cbtScalar& planeConstant = planeShape->getPlaneConstant();

	cbtTransform convexWorldTransform = convexObjWrap->getWorldTransform();
	cbtTransform convexInPlaneTrans;
	convexInPlaneTrans = planeObjWrap->getWorldTransform().inverse() * convexWorldTransform;
	//now perturbe the convex-world transform
	convexWorldTransform.getBasis() *= cbtMatrix3x3(perturbeRot);
	cbtTransform planeInConvex;
	planeInConvex = convexWorldTransform.inverse() * planeObjWrap->getWorldTransform();

	cbtVector3 vtx = convexShape->localGetSupportingVertex(planeInConvex.getBasis() * -planeNormal);

	cbtVector3 vtxInPlane = convexInPlaneTrans(vtx);
	cbtScalar distance = (planeNormal.dot(vtxInPlane) - planeConstant);

	cbtVector3 vtxInPlaneProjected = vtxInPlane - distance * planeNormal;
	cbtVector3 vtxInPlaneWorld = planeObjWrap->getWorldTransform() * vtxInPlaneProjected;

	hasCollision = distance < m_manifoldPtr->getContactBreakingThreshold();
	resultOut->setPersistentManifold(m_manifoldPtr);
	if (hasCollision)
	{
		/// report a contact. internally this will be kept persistent, and contact reduction is done
		cbtVector3 normalOnSurfaceB = planeObjWrap->getWorldTransform().getBasis() * planeNormal;
		cbtVector3 pOnB = vtxInPlaneWorld;
		resultOut->addContactPoint(normalOnSurfaceB, pOnB, distance);
	}
}